

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ManArrayShuffle(Vec_Int_t *vArray)

{
  int iVar1;
  uint uVar2;
  int Temp;
  int iNext;
  int i;
  Vec_Int_t *vArray_local;
  
  for (Temp = 0; Temp < vArray->nSize; Temp = Temp + 1) {
    uVar2 = Gia_ManRandom(0);
    uVar2 = uVar2 % (uint)vArray->nSize;
    iVar1 = vArray->pArray[Temp];
    vArray->pArray[Temp] = vArray->pArray[(int)uVar2];
    vArray->pArray[(int)uVar2] = iVar1;
  }
  return;
}

Assistant:

void Frc_ManArrayShuffle( Vec_Int_t * vArray )
{
    int i, iNext, Temp;
    for ( i = 0; i < vArray->nSize; i++ )
    {
        iNext = Gia_ManRandom( 0 ) % vArray->nSize;
        Temp = vArray->pArray[i];
        vArray->pArray[i] = vArray->pArray[iNext];
        vArray->pArray[iNext] = Temp;
    }
}